

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d64_q1a_card_battle.cpp
# Opt level: O3

int main(void)

{
  size_t *psVar1;
  undefined1 *puVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr *pp_Var4;
  istream *this;
  mapped_type *pmVar5;
  long lVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  iterator __position;
  int iVar9;
  int iVar10;
  int tmp;
  int m;
  int t;
  int n;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> to_pow;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  iVar10 = 0;
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105180) = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_64);
  std::istream::operator>>(this,&local_6c);
  p_Var3 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  if (0 < local_64) {
    do {
      std::istream::operator>>((istream *)&std::cin,&local_70);
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_60,&local_70);
      *pmVar5 = *pmVar5 + 1;
      iVar10 = iVar10 + 1;
    } while (iVar10 < local_64);
  }
  if (local_6c < 1) {
    iVar10 = 1;
  }
  else {
    iVar9 = 0;
    do {
      iVar10 = iVar9;
      std::istream::operator>>((istream *)&std::cin,&local_70);
      if (0 < local_70) {
        iVar9 = 0;
        do {
          std::istream::operator>>((istream *)&std::cin,&local_68);
          if ((local_60._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (lVar6 = std::_Rb_tree_decrement(&p_Var3->_M_header),
             *(int *)(lVar6 + 0x20) <= local_68)) {
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            goto LAB_00101410;
          }
          p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          __position._M_node = &p_Var3->_M_header;
          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0010138a:
            __position._M_node = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          else {
            do {
              psVar1 = (size_t *)(p_Var7 + 1);
              if (local_68 < (int)*psVar1) {
                __position._M_node = p_Var7;
              }
              pp_Var4 = &p_Var7->_M_left;
              p_Var7 = pp_Var4[(int)*psVar1 <= local_68];
            } while (pp_Var4[(int)*psVar1 <= local_68] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)__position._M_node == p_Var3) goto LAB_0010138a;
          }
          puVar2 = &__position._M_node[1].field_0x4;
          *(int *)puVar2 = *(int *)puVar2 + -1;
          if (*(int *)puVar2 == 0) {
            std::
            _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
            ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                                *)&local_60,__position);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 < local_70);
      }
      iVar9 = iVar10 + 1;
    } while (iVar10 + 1 < local_6c);
    iVar10 = iVar10 + 2;
  }
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
LAB_00101410:
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int n, m;
    cin >> n >> m;
    map<int,int> to_pow;
    for (int i = 0; i < n; ++i) {
        // cin >> to_pow[i];
        int tmp;
        cin >> tmp;
        ++to_pow[tmp];
    }
    int winnings = 0;
    for (int i = 0; i < m; ++i) {
        int c,t;
        cin >> c;
        for (int j = 0; j < c; ++j) {
            cin >> t;
            auto end = --to_pow.end();
            if (to_pow.size() == 0 || end->first <= t) {
                cout << winnings + 1 << "\n";
                return 0;
            }
            // auto used_card = upper_bound(to_pow.begin() + new_beg, to_pow.end(), t);
            auto used_card = to_pow.upper_bound(t);
            if (used_card == to_pow.end()) {
                // to_pow.erase(to_pow.begin());
                to_pow.begin()->second--;
                if (to_pow.begin()->second == 0) {
                    to_pow.erase(to_pow.begin());
                }
            } else {
                // to_pow.erase(used_card);
                used_card->second--;
                if (used_card->second == 0) {
                    to_pow.erase(used_card);
                }
            }
        }
        ++winnings;
    }
    cout << winnings + 1 << "\n";
}